

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::substring::
     merge_backward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator buf,iterator first,iterator middle,iterator last,
               value_type depth)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pos_type pVar4;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  int extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  int extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  int extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  int extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  int extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  int extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  int extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  BitmapArray<long> *pBVar5;
  pos_type pVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  iterator p1;
  iterator p2;
  ulong local_80;
  
  uVar10 = buf.pos_;
  pBVar5 = buf.array_;
  pVar6 = PA.pos_;
  p1.array_ = PA.array_;
  helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
            (middle,last,buf);
  local_80 = ~middle.pos_ + last.pos_ + uVar10;
  (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
  iVar1 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
  lVar7 = middle.pos_ - 1;
  (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar7);
  bVar13 = extraout_var_01 < 0;
  if (bVar13) {
    iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar7);
    uVar9 = ~CONCAT44(extraout_var_03,iVar2);
  }
  else {
    iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar7);
    uVar9 = CONCAT44(extraout_var_02,iVar2);
  }
  uVar3 = extraout_var >> 0x1f;
  uVar8 = CONCAT44(extraout_var_00,iVar1) ^ (long)(int)extraout_var >> 0x1f;
  pVar4 = uVar9 + pVar6;
  lVar7 = last.pos_ - 1;
  iVar1 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
  uVar9 = middle.pos_ - 1;
LAB_00109cb2:
  do {
    p1.pos_ = uVar8 + pVar6;
    while( true ) {
      p2.pos_ = pVar4;
      p2.array_ = p1.array_;
      iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
      if (0 < iVar2) goto LAB_00109def;
      if (-1 < iVar2) break;
      uVar8 = uVar9;
      lVar11 = lVar7;
      if (bVar13) {
        do {
          lVar11 = lVar7 + -1;
          iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar8);
          (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (last.array_,lVar7,CONCAT44(extraout_var_05,iVar2));
          uVar9 = uVar8 - 1;
          iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar11);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,uVar8,CONCAT44(extraout_var_06,iVar2));
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
          uVar8 = uVar9;
          lVar7 = lVar11;
        } while (extraout_var_07 < 0);
        bVar13 = false;
      }
      lVar7 = lVar11 + -1;
      iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
      (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last.array_,lVar11,CONCAT44(extraout_var_08,iVar2));
      iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
      (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                (middle.array_,uVar9,CONCAT44(extraout_var_09,iVar2));
      uVar8 = local_80;
      if (uVar9 <= first.pos_) goto joined_r0x0010a186;
      uVar9 = uVar9 - 1;
      (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
      if (extraout_var_10 < 0) {
        bVar13 = true;
        iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
        uVar8 = ~CONCAT44(extraout_var_12,iVar2);
      }
      else {
        iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
        uVar8 = CONCAT44(extraout_var_11,iVar2);
      }
      pVar4 = uVar8 + pVar6;
    }
    lVar11 = lVar7;
    if (uVar3 != 0) {
      do {
        lVar11 = lVar7 + -1;
        iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,lVar7,CONCAT44(extraout_var_20,iVar2));
        uVar8 = local_80 - 1;
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar11);
        (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,local_80,CONCAT44(extraout_var_21,iVar2));
        (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar8);
        lVar7 = lVar11;
        local_80 = uVar8;
      } while (extraout_var_22 < 0);
      uVar3 = 0;
    }
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
    lVar12 = lVar11 + -1;
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,lVar11,~CONCAT44(extraout_var_23,iVar2));
    iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar12);
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,local_80,CONCAT44(extraout_var_24,iVar2));
    if (local_80 <= uVar10) goto LAB_0010a25f;
    uVar8 = uVar9;
    lVar7 = lVar12;
    if (bVar13) {
      do {
        lVar12 = lVar7 + -1;
        iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar8);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,lVar7,CONCAT44(extraout_var_25,iVar2));
        uVar9 = uVar8 - 1;
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar12);
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (middle.array_,uVar8,CONCAT44(extraout_var_26,iVar2));
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
        uVar8 = uVar9;
        lVar7 = lVar12;
      } while (extraout_var_27 < 0);
      bVar13 = false;
    }
    local_80 = local_80 - 1;
    lVar7 = lVar12 + -1;
    iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,lVar12,CONCAT44(extraout_var_28,iVar2));
    iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
    (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
              (middle.array_,uVar9,CONCAT44(extraout_var_29,iVar2));
    uVar8 = local_80;
    if (uVar9 <= first.pos_) {
      for (; uVar10 < local_80; local_80 = local_80 - 1) {
        iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,lVar7,CONCAT44(extraout_var_39,iVar2));
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7 + -1);
        (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,local_80,CONCAT44(extraout_var_40,iVar2));
        uVar8 = uVar10;
        lVar7 = lVar7 + -1;
      }
      goto LAB_0010a243;
    }
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
    if (extraout_var_30 < 0) {
      uVar3 = 1;
      iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
      uVar8 = ~CONCAT44(extraout_var_33,iVar2);
    }
    else {
      iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
      uVar8 = CONCAT44(extraout_var_31,iVar2);
    }
    uVar9 = uVar9 - 1;
    (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
    if (extraout_var_34 < 0) {
      bVar13 = true;
      iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
      pVar4 = ~CONCAT44(extraout_var_36,iVar2) + pVar6;
    }
    else {
      iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar9);
      pVar4 = CONCAT44(extraout_var_35,iVar2) + pVar6;
    }
  } while( true );
LAB_00109def:
  lVar11 = lVar7;
  if (uVar3 != 0) {
    do {
      lVar11 = lVar7 + -1;
      iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
      (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last.array_,lVar7,CONCAT44(extraout_var_13,iVar2));
      uVar8 = local_80 - 1;
      iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar11);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,local_80,CONCAT44(extraout_var_14,iVar2));
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar8);
      lVar7 = lVar11;
      local_80 = uVar8;
    } while (extraout_var_15 < 0);
    uVar3 = 0;
  }
  lVar7 = lVar11 + -1;
  iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
  (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
            (last.array_,lVar11,CONCAT44(extraout_var_16,iVar2));
  iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7);
  (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,local_80,CONCAT44(extraout_var_17,iVar2));
  if (local_80 <= uVar10) goto LAB_0010a25f;
  local_80 = local_80 - 1;
  (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
  if (extraout_var_18 < 0) {
    uVar3 = 1;
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
    uVar8 = ~CONCAT44(extraout_var_32,iVar2);
  }
  else {
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
    uVar8 = CONCAT44(extraout_var_19,iVar2);
  }
  goto LAB_00109cb2;
joined_r0x0010a186:
  for (; uVar10 < local_80; local_80 = local_80 - 1) {
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,local_80);
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,lVar7,CONCAT44(extraout_var_37,iVar2));
    iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,lVar7 + -1);
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,local_80,CONCAT44(extraout_var_38,iVar2));
    lVar7 = lVar7 + -1;
    uVar8 = uVar10;
  }
LAB_0010a243:
  iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,uVar8);
  (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
            (last.array_,lVar7,CONCAT44(extraout_var_41,iVar2));
LAB_0010a25f:
  (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,uVar10,CONCAT44(extraout_var_04,iVar1));
  return;
}

Assistant:

void merge_backward(
    const StringIterator_type T, const SAIterator_type PA, BufIterator_type buf,
    SAIterator_type first, SAIterator_type middle, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type p1, p2;
  SAIterator_type i, k;
  BufIterator_type j, bufend;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r, x;

  bufend = buf + (last - middle);
  helper::vecswap(middle, last, buf);

  x = 0;
  if (*(bufend - 1) < 0) {
    x |= 1;
    p1 = PA + ~*(bufend - 1);
  } else {
    p1 = PA + *(bufend - 1);
  }
  if (*(middle - 1) < 0) {
    x |= 2;
    p2 = PA + ~*(middle - 1);
  } else {
    p2 = PA + *(middle - 1);
  }
  for (t = *(last - 1), i = last - 1, j = bufend - 1, k = middle - 1;;) {

    r = compare(T, p1, p2, depth);
    if (r > 0) {
      if (x & 1) {
        do {
          *i-- = *j;
          *j-- = *i;
        } while (*j < 0);
        x ^= 1;
      }
      *i-- = *j;
      *j = *i;
      if (j <= buf) {
        *buf = t;
        return;
      }

      if (*--j < 0) {
        x |= 1;
        p1 = PA + ~*j;
      } else {
        p1 = PA + *j;
      }
    } else if (r < 0) {
      if (x & 2) {
        do {
          *i-- = *k;
          *k-- = *i;
        } while (*k < 0);
        x ^= 2;
      }
      *i-- = *k;
      *k = *i;
      if (k <= first) {
        while (buf < j) {
          *i-- = *j;
          *j-- = *i;
        }
        *i = *j, *buf = t;
        return;
      }

      if (*--k < 0) {
        x |= 2;
        p2 = PA + ~*k;
      } else {
        p2 = PA + *k;
      }
    } else {
      if (x & 1) {
        do {
          *i-- = *j;
          *j-- = *i;
        } while (*j < 0);
        x ^= 1;
      }
      *i-- = ~*j;
      *j = *i;
      if (j <= buf) {
        *buf = t;
        return;
      }
      --j;

      if (x & 2) {
        do {
          *i-- = *k;
          *k-- = *i;
        } while (*k < 0);
        x ^= 2;
      }
      *i-- = *k;
      *k = *i;
      if (k <= first) {
        while (buf < j) {
          *i-- = *j;
          *j-- = *i;
        }
        *i = *j, *buf = t;
        return;
      }
      --k;

      if (*j < 0) {
        x |= 1;
        p1 = PA + ~*j;
      } else {
        p1 = PA + *j;
      }
      if (*k < 0) {
        x |= 2;
        p2 = PA + ~*k;
      } else {
        p2 = PA + *k;
      }
    }
  }
}